

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctkern__init(fctkern_t *nk,int argc,char **argv)

{
  void **ppvVar1;
  
  if (argc == 0 && argv == (char **)0x0) {
    return 0;
  }
  memset(nk,0,0x1f8);
  ppvVar1 = (void **)malloc(0x40);
  (nk->cl_parser).clo_list.itm_list = ppvVar1;
  if (ppvVar1 != (void **)0x0) {
    (nk->cl_parser).clo_list.avail_itm_num = 8;
    (nk->cl_parser).clo_list.used_itm_num = 0;
    ppvVar1 = (void **)malloc(0x40);
    (nk->cl_parser).param_list.itm_list = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      (nk->cl_parser).param_list.avail_itm_num = 8;
      (nk->cl_parser).param_list.used_itm_num = 0;
      goto LAB_00102437;
    }
  }
  fct_clp__final(&nk->cl_parser);
LAB_00102437:
  ppvVar1 = (void **)malloc(0x40);
  (nk->logger_list).itm_list = ppvVar1;
  if (ppvVar1 != (void **)0x0) {
    (nk->logger_list).avail_itm_num = 8;
    (nk->logger_list).used_itm_num = 0;
  }
  nk->lt_usr = (fct_logger_types_t *)0x0;
  nk->lt_sys = FCT_LOGGER_TYPES;
  nk->cl_is_parsed = 0;
  (nk->prefix_list).itm_list = (void **)0x0;
  (nk->prefix_list).avail_itm_num = 0;
  (nk->prefix_list).used_itm_num = 0;
  (nk->ts_list).itm_list = (void **)0x0;
  (nk->ts_list).avail_itm_num = 0;
  (nk->ts_list).used_itm_num = 0;
  nk->cl_argc = argc;
  nk->cl_argv = argv;
  (nk->ns).ts_curr = (fct_ts_t *)0x0;
  *(undefined8 *)&(nk->ns).ts_is_skip_suite = 0;
  (nk->ns).ts_skip_cndtn = (char *)0x0;
  (nk->ns).curr_test_name = (char *)0x0;
  (nk->ns).curr_test = (fct_test_t *)0x0;
  (nk->ns).test_skip_cndtn = (char *)0x0;
  (nk->ns).test_is_skip = 0;
  (nk->ns).test_num = 0;
  (nk->ns).num_total_failed = 0;
  return 1;
}

Assistant:

static int
fctkern__init(fctkern_t *nk, int argc, const char *argv[])
{
    if ( argc == 0 && argv == NULL )
    {
        return 0;
    }
    memset(nk, 0, sizeof(fctkern_t));
    fct_clp__init(&(nk->cl_parser), NULL);
    fct_nlist__init(&(nk->logger_list));
    nk->lt_usr = NULL;  /* Supplied via 'install' mechanics. */
    nk->lt_sys = FCT_LOGGER_TYPES;
    fct_nlist__init2(&(nk->prefix_list), 0);
    fct_nlist__init2(&(nk->ts_list), 0);
    nk->cl_is_parsed =0;
    /* Save a copy of the arguments. We do a delay parse of the command
    line arguments in order to allow the client code to optionally configure
    the command line parser.*/
    nk->cl_argc = argc;
    nk->cl_argv = argv;
    fct_namespace_init(&(nk->ns));
    return 1;
}